

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void ungroup_general_undo_redo(Am_Object *command_obj,bool selective)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  undefined1 local_188 [8];
  Am_Value_List new_selected_objs_1;
  Am_Object local_170;
  Am_Object local_168;
  Am_Value_List local_160;
  Am_Object local_150;
  Am_Value_List local_148;
  Am_Object local_138;
  Am_Value_List local_130;
  Am_Value_List local_120;
  Am_Object local_110;
  Am_Object local_108;
  Am_Value_List local_100;
  Am_Value_List local_f0;
  Am_Value_List local_e0;
  Am_Object local_d0;
  undefined1 local_c8 [8];
  Am_Value_List new_selected_objs;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Value_List local_a0;
  Am_Object local_90;
  Am_Value_List local_88;
  byte local_71;
  bool currently_undone;
  Am_Object local_68;
  undefined1 local_60 [8];
  Am_Value_List places;
  Am_Value_List sub_groups;
  Am_Object selection_widget;
  Am_Object local_28;
  Am_Object sub_group;
  Am_Object group;
  bool selective_local;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&sub_group);
  Am_Object::Am_Object(&local_28);
  Am_Object::Am_Object((Am_Object *)&sub_groups.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&places.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_60);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff90,command_obj);
  Am_Get_Selection_Widget_For_Command(&local_68);
  Am_Object::operator=((Am_Object *)&sub_groups.item,&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff90);
  pAVar1 = Am_Object::Get(command_obj,0x171,0);
  Am_Object::operator=(&sub_group,pAVar1);
  pAVar1 = Am_Object::Get(command_obj,0x16d,0);
  Am_Value_List::operator=((Am_Value_List *)&places.item,pAVar1);
  if (!selective) {
    pAVar1 = Am_Object::Get(command_obj,0x1e4,0);
    Am_Value_List::operator=((Am_Value_List *)local_60,pAVar1);
  }
  pAVar1 = Am_Object::Get(command_obj,0x16f,0);
  local_71 = Am_Value::operator_cast_to_bool(pAVar1);
  if ((bool)local_71) {
    if (selective) {
      Am_Error("** Shouldn\'t be possible to redo if selective");
    }
    Am_Value_List::Am_Value_List(&local_88,(Am_Value_List *)&places.item);
    Am_Object::Am_Object(&local_90,&sub_group);
    in_or_out_of_sub_groups(&local_88,&local_90,false,false);
    Am_Object::~Am_Object(&local_90);
    Am_Value_List::~Am_Value_List(&local_88);
    Am_Value_List::Am_Value_List(&local_a0,(Am_Value_List *)&places.item);
    Am_Object::Am_Object(&local_a8,&sub_group);
    Am_Object::Am_Object(&local_b0,&Am_No_Object);
    Am_Object::Am_Object((Am_Object *)&new_selected_objs.item,&Am_No_Object);
    remove_and_add_objects(&local_a0,&local_a8,&local_b0,(Am_Object *)&new_selected_objs.item);
    Am_Object::~Am_Object((Am_Object *)&new_selected_objs.item);
    Am_Object::~Am_Object(&local_b0);
    Am_Object::~Am_Object(&local_a8);
    Am_Value_List::~Am_Value_List(&local_a0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_c8);
    pAVar1 = Am_Object::Get(command_obj,0x169,0);
    Am_Value_List::operator=((Am_Value_List *)local_c8,pAVar1);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_c8);
    Am_Object::Set((Am_Object *)&sub_groups.item,0x169,pAVar2,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_c8);
  }
  else {
    if (selective) {
      Am_Object::Am_Object(&local_110,&sub_group);
      Am_Value_List::Am_Value_List(&local_120,(Am_Value_List *)&places.item);
      Am_Put_Objects_Into_Group(&local_110,&local_120);
      Am_Value_List::~Am_Value_List(&local_120);
      Am_Object::~Am_Object(&local_110);
      Am_Value_List::Am_Value_List(&local_130,(Am_Value_List *)&places.item);
      Am_Object::Am_Object(&local_138,&sub_group);
      in_or_out_of_sub_groups(&local_130,&local_138,true,true);
      Am_Object::~Am_Object(&local_138);
      Am_Value_List::~Am_Value_List(&local_130);
    }
    else {
      Am_Object::Am_Object(&local_d0,&sub_group);
      Am_Value_List::Am_Value_List(&local_e0,(Am_Value_List *)&places.item);
      Am_Value_List::Am_Value_List(&local_f0,(Am_Value_List *)local_60);
      Am_Put_Objects_Back_In_Place(&local_d0,&local_e0,&local_f0,true);
      Am_Value_List::~Am_Value_List(&local_f0);
      Am_Value_List::~Am_Value_List(&local_e0);
      Am_Object::~Am_Object(&local_d0);
      Am_Value_List::Am_Value_List(&local_100,(Am_Value_List *)&places.item);
      Am_Object::Am_Object(&local_108,&sub_group);
      in_or_out_of_sub_groups(&local_100,&local_108,true,false);
      Am_Object::~Am_Object(&local_108);
      Am_Value_List::~Am_Value_List(&local_100);
    }
    Am_Value_List::Am_Value_List(&local_148,(Am_Value_List *)&places.item);
    Am_Object::Am_Object(&local_150,&sub_group);
    in_or_out_of_sub_groups(&local_148,&local_150,false,false);
    Am_Object::~Am_Object(&local_150);
    Am_Value_List::~Am_Value_List(&local_148);
    Am_Value_List::Am_Value_List(&local_160,(Am_Value_List *)&places.item);
    Am_Object::Am_Object(&local_168,&sub_group);
    Am_Object::Am_Object(&local_170,&Am_No_Object);
    Am_Object::Am_Object((Am_Object *)&new_selected_objs_1.item,&Am_No_Object);
    remove_and_add_objects(&local_160,&local_168,&local_170,(Am_Object *)&new_selected_objs_1.item);
    Am_Object::~Am_Object((Am_Object *)&new_selected_objs_1.item);
    Am_Object::~Am_Object(&local_170);
    Am_Object::~Am_Object(&local_168);
    Am_Value_List::~Am_Value_List(&local_160);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&places.item);
    Am_Object::Set((Am_Object *)&sub_groups.item,0x169,pAVar2,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_188);
    pAVar1 = Am_Object::Get(command_obj,0x169,0);
    Am_Value_List::operator=((Am_Value_List *)local_188,pAVar1);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_188);
    Am_Object::Set((Am_Object *)&sub_groups.item,0x169,pAVar2,0);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_188);
  }
  Am_Object::Set(command_obj,0x16f,(bool)(~local_71 & 1),0);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&places.item);
  Am_Object::~Am_Object((Am_Object *)&sub_groups.item);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&sub_group);
  return;
}

Assistant:

void
ungroup_general_undo_redo(Am_Object command_obj, bool selective)
{
  Am_Object group, sub_group, selection_widget;
  Am_Value_List sub_groups, places;
  selection_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  group = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
  sub_groups = command_obj.Get(Am_OBJECT_MODIFIED);
  if (!selective)
    places = command_obj.Get(Am_OBJECT_MODIFIED_PLACES);
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);

  if (currently_undone) { // then redo = ungroup objects again.
                          // Places should still be valid
    if (selective)
      Am_Error("** Shouldn't be possible to redo if selective");
    //remove objects from sub_groups
    in_or_out_of_sub_groups(sub_groups, group, false, false);
    //remove the sub_groups from group
    remove_and_add_objects(sub_groups, group, Am_No_Object);

    //set the selection
    Am_Value_List new_selected_objs;
    new_selected_objs = command_obj.Get(Am_VALUE);
    selection_widget.Set(Am_VALUE, new_selected_objs);
  } else { // undo = restore groups and put objects into them
    if (!selective) {
      Am_Put_Objects_Back_In_Place(group, sub_groups, places, true);
      //move objects back into the groups
      in_or_out_of_sub_groups(sub_groups, group, true, false);
    } else {
      Am_Put_Objects_Into_Group(group, sub_groups);
      in_or_out_of_sub_groups(sub_groups, group, true, true);
    }
    //remove objects from sub_groups
    in_or_out_of_sub_groups(sub_groups, group, false, false);
    //remove the sub_groups from group
    remove_and_add_objects(sub_groups, group, Am_No_Object);

    //now set the selection.
    selection_widget.Set(Am_VALUE, sub_groups);
    //set the selection
    Am_Value_List new_selected_objs;
    new_selected_objs = command_obj.Get(Am_VALUE);
    selection_widget.Set(Am_VALUE, new_selected_objs);
  }
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}